

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

void __thiscall de::BlockBuffer<unsigned_char>::flush(BlockBuffer<unsigned_char> *this)

{
  BlockBuffer<unsigned_char> *this_local;
  
  Mutex::lock(&this->m_writeLock);
  if (0 < this->m_writePos) {
    flushWriteBlock(this);
  }
  Mutex::unlock(&this->m_writeLock);
  return;
}

Assistant:

void BlockBuffer<T>::flush (void)
{
	m_writeLock.lock();

	if (m_writePos > 0)
		flushWriteBlock();

	m_writeLock.unlock();
}